

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_type.cpp
# Opt level: O2

CatalogType duckdb::CatalogTypeFromString(string *type)

{
  bool bVar1;
  CatalogType CVar2;
  InternalException *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = ::std::operator==(type,"Collation");
  CVar2 = COLLATION_ENTRY;
  if (!bVar1) {
    bVar1 = ::std::operator==(type,"Type");
    CVar2 = TYPE_ENTRY;
    if (!bVar1) {
      bVar1 = ::std::operator==(type,"Table");
      CVar2 = TABLE_ENTRY;
      if (!bVar1) {
        bVar1 = ::std::operator==(type,"Schema");
        CVar2 = SCHEMA_ENTRY;
        if (!bVar1) {
          bVar1 = ::std::operator==(type,"Database");
          CVar2 = DATABASE_ENTRY;
          if (!bVar1) {
            bVar1 = ::std::operator==(type,"Table Function");
            CVar2 = TABLE_FUNCTION_ENTRY;
            if (!bVar1) {
              bVar1 = ::std::operator==(type,"Scalar Function");
              CVar2 = SCALAR_FUNCTION_ENTRY;
              if (!bVar1) {
                bVar1 = ::std::operator==(type,"Aggregate Function");
                CVar2 = AGGREGATE_FUNCTION_ENTRY;
                if (!bVar1) {
                  bVar1 = ::std::operator==(type,"Copy Function");
                  CVar2 = COPY_FUNCTION_ENTRY;
                  if (!bVar1) {
                    bVar1 = ::std::operator==(type,"Pragma Function");
                    CVar2 = PRAGMA_FUNCTION_ENTRY;
                    if (!bVar1) {
                      bVar1 = ::std::operator==(type,"Macro Function");
                      CVar2 = MACRO_ENTRY;
                      if (!bVar1) {
                        bVar1 = ::std::operator==(type,"Table Macro Function");
                        CVar2 = TABLE_MACRO_ENTRY;
                        if (!bVar1) {
                          bVar1 = ::std::operator==(type,"View");
                          CVar2 = VIEW_ENTRY;
                          if (!bVar1) {
                            bVar1 = ::std::operator==(type,"Index");
                            CVar2 = INDEX_ENTRY;
                            if (!bVar1) {
                              bVar1 = ::std::operator==(type,"Prepared Statement");
                              CVar2 = PREPARED_STATEMENT;
                              if (!bVar1) {
                                bVar1 = ::std::operator==(type,"Sequence");
                                CVar2 = SEQUENCE_ENTRY;
                                if (!bVar1) {
                                  bVar1 = ::std::operator==(type,"INVALID");
                                  if (!bVar1) {
                                    this = (InternalException *)__cxa_allocate_exception(0x10);
                                    ::std::__cxx11::string::string
                                              ((string *)&local_38,"Unrecognized CatalogType \'%s\'"
                                               ,&local_59);
                                    ::std::__cxx11::string::string
                                              ((string *)&local_58,(string *)type);
                                    InternalException::InternalException<std::__cxx11::string>
                                              (this,&local_38,&local_58);
                                    __cxa_throw(this,&InternalException::typeinfo,
                                                ::std::runtime_error::~runtime_error);
                                  }
                                  CVar2 = INVALID;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return CVar2;
}

Assistant:

CatalogType CatalogTypeFromString(const string &type) {
	if (type == "Collation") {
		return CatalogType::COLLATION_ENTRY;
	}
	if (type == "Type") {
		return CatalogType::TYPE_ENTRY;
	}
	if (type == "Table") {
		return CatalogType::TABLE_ENTRY;
	}
	if (type == "Schema") {
		return CatalogType::SCHEMA_ENTRY;
	}
	if (type == "Database") {
		return CatalogType::DATABASE_ENTRY;
	}
	if (type == "Table Function") {
		return CatalogType::TABLE_FUNCTION_ENTRY;
	}
	if (type == "Scalar Function") {
		return CatalogType::SCALAR_FUNCTION_ENTRY;
	}
	if (type == "Aggregate Function") {
		return CatalogType::AGGREGATE_FUNCTION_ENTRY;
	}
	if (type == "Copy Function") {
		return CatalogType::COPY_FUNCTION_ENTRY;
	}
	if (type == "Pragma Function") {
		return CatalogType::PRAGMA_FUNCTION_ENTRY;
	}
	if (type == "Macro Function") {
		return CatalogType::MACRO_ENTRY;
	}
	if (type == "Table Macro Function") {
		return CatalogType::TABLE_MACRO_ENTRY;
	}
	if (type == "View") {
		return CatalogType::VIEW_ENTRY;
	}
	if (type == "Index") {
		return CatalogType::INDEX_ENTRY;
	}
	if (type == "Prepared Statement") {
		return CatalogType::PREPARED_STATEMENT;
	}
	if (type == "Sequence") {
		return CatalogType::SEQUENCE_ENTRY;
	}
	if (type == "INVALID") {
		return CatalogType::INVALID;
	}
	throw InternalException("Unrecognized CatalogType '%s'", type);
}